

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libc_wrappers.c
# Opt level: O0

int gotcha_strcmp(char *in_one,char *in_two)

{
  int i;
  char *in_two_local;
  char *in_one_local;
  
  i = 0;
  while( true ) {
    if (in_one[i] == '\0') {
      return (uint)(in_two[i] != '\0');
    }
    if (in_one[i] != in_two[i]) break;
    i = i + 1;
  }
  return (int)in_one[i] - (int)in_two[i];
}

Assistant:

int gotcha_strcmp(const char *in_one, const char *in_two)
{
  int i = 0;
  for (;; i++) {
    if (in_one[i] == '\0') {
      return (in_two[i] == '\0') ? 0 : 1;
    }
    if (in_one[i] != in_two[i]) {
      return in_one[i] - in_two[i];
    }
  }
}